

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

void __thiscall
jessilib::make_json_string<char8_t,char8_t>
          (jessilib *this,
          basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *out_string,
          u8string_view in_string)

{
  char32_t __val;
  undefined8 in_RAX;
  char *pcVar1;
  char8_t *pcVar2;
  char8_t *extraout_RDX;
  size_type __n;
  char8_t *extraout_RDX_00;
  char8_t *extraout_RDX_01;
  char8_t *extraout_RDX_02;
  size_type __pos;
  char8_t *__s;
  decode_result dVar3;
  __integer_to_chars_result_type<unsigned_int> _Var4;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_00;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_01;
  char data [2];
  undefined8 uStack_38;
  
  __s = (char8_t *)in_string._M_len;
  uStack_38 = in_RAX;
  std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::reserve
            ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)this,
             (long)&(out_string->_M_dataplus)._M_p + *(long *)(this + 8) + 2);
  std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::
  push_back((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)this,'\"')
  ;
  in_string_00._M_str = extraout_RDX;
  in_string_00._M_len = (size_t)__s;
  dVar3 = decode_codepoint_utf8<char8_t>((jessilib *)out_string,in_string_00);
  __n = dVar3.units;
  if (__n != 0) {
    __val = dVar3.codepoint;
    do {
      if (__val == L'\"') {
        __pos = *(size_type *)(this + 8);
        pcVar2 = "\\\"";
LAB_0017dc69:
        std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::
        replace((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)this,
                __pos,0,pcVar2,2);
        pcVar2 = extraout_RDX_00;
      }
      else {
        if (__val == L'\\') {
          __pos = *(size_type *)(this + 8);
          pcVar2 = "\\\\";
          goto LAB_0017dc69;
        }
        if ((uint)__val < 0x20) {
          std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::
          replace((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)this
                  ,*(size_type *)(this + 8),0,"\\u00",4);
          if (__val == L'\0') {
            uStack_38._0_7_ = CONCAT16(0x30,(undefined6)uStack_38);
            pcVar1 = (char *)((long)&uStack_38 + 7);
          }
          else {
            _Var4 = std::__detail::__to_chars_16<unsigned_int>
                              ((char *)((long)&uStack_38 + 6),&stack0xffffffffffffffd0,__val);
            pcVar1 = _Var4.ptr;
          }
          if (pcVar1 == (char *)((long)&uStack_38 + 6)) {
            __pos = *(size_type *)(this + 8);
            pcVar2 = "00";
          }
          else {
            if (pcVar1 != &stack0xffffffffffffffd0) {
              std::__cxx11::
              basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::push_back
                        ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
                          *)this,'0');
              std::__cxx11::
              basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::push_back
                        ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
                          *)this,uStack_38._6_1_);
              pcVar2 = extraout_RDX_01;
              goto LAB_0017dc6e;
            }
            __pos = *(size_type *)(this + 8);
            pcVar2 = (char8_t *)((long)&uStack_38 + 6);
          }
          goto LAB_0017dc69;
        }
        std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::
        append((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)this,
               __s,__n);
        pcVar2 = extraout_RDX_02;
      }
LAB_0017dc6e:
      __s = __s + __n;
      out_string = (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
                   ((long)out_string - __n);
      in_string_01._M_str = pcVar2;
      in_string_01._M_len = (size_t)__s;
      dVar3 = decode_codepoint_utf8<char8_t>((jessilib *)out_string,in_string_01);
      __n = dVar3.units;
      __val = dVar3.codepoint;
    } while (__n != 0);
  }
  std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::
  push_back((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)this,'\"')
  ;
  return;
}

Assistant:

void make_json_string(std::basic_string<ResultCharT>& out_string, std::u8string_view in_string) {
	using namespace std::literals;
	out_string.reserve(out_string.size() + in_string.size() + 2);
	simple_append<CharT, ResultCharT>(out_string, '\"');

	decode_result decode;
	while ((decode = decode_codepoint(in_string)).units != 0) {
		if (decode.codepoint == U'\\') { // backslash
			simple_append<CharT, ResultCharT>(out_string, u8"\\\\"sv);
		}
		else if (decode.codepoint == U'\"') { // quotation
			simple_append<CharT, ResultCharT>(out_string, u8"\\\""sv);
		}
		else if (decode.codepoint < 0x20) { // control characters
			simple_append<CharT, ResultCharT>(out_string, u8"\\u00"sv);

			// overwrite last 2 zeroes with correct hexadecimal sequence
			char data[2]; // Will only ever use 2 chars
			char* data_end = data + sizeof(data);
			auto to_chars_result = std::to_chars(data, data_end, static_cast<uint32_t>(decode.codepoint), 16);
			if (to_chars_result.ptr == data) {
				// No bytes written
				simple_append<CharT, ResultCharT>(out_string, u8"00"sv);
			}
			else if (to_chars_result.ptr != data_end) {
				// 1 byte written
				simple_append<CharT, ResultCharT>(out_string, '0');
				simple_append<CharT, ResultCharT>(out_string, data[0]);
			}
			else {
				// 2 bytes written
				simple_append<CharT, ResultCharT>(out_string, std::u8string_view{ reinterpret_cast<char8_t*>(data), sizeof(data) });
			}
		}
		else {
			if constexpr (sizeof(CharT) == sizeof(char8_t) && sizeof(CharT) == sizeof(ResultCharT)) {
				// Valid UTF-8 sequence; copy it over
				out_string.append(reinterpret_cast<const ResultCharT*>(in_string.data()), decode.units);
			}
			else if constexpr (sizeof(CharT) == sizeof(ResultCharT)){
				// Valid UTF-8 codepoint; append it
				encode_codepoint(out_string, decode.codepoint);
			}
			else {
				// Valid UTF-8 codepoint; encode & append it
				encode_buffer_type<CharT> buffer;
				size_t units_written = encode_codepoint(buffer, decode.codepoint);
				out_string.append(reinterpret_cast<ResultCharT*>(buffer), units_written * sizeof(CharT));
			}
		}

		in_string.remove_prefix(decode.units);
	}

	simple_append<CharT, ResultCharT>(out_string, '\"');
}